

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

Var Js::JavascriptExternalFunction::HandleRecordReplayExternalFunction_StdThunk
              (RecyclableObject *function,CallInfo *callInfo,Arguments *args,
              ScriptContext *scriptContext)

{
  undefined2 uVar1;
  Type *pTVar2;
  Type ppvVar3;
  TTDNestingDepthAutoAdjuster this;
  bool bVar4;
  ThreadContext *pTVar5;
  JavascriptLibrary *this_00;
  void **ppvVar6;
  RecyclableObject *local_128;
  RecyclableObject *local_118;
  undefined1 local_c0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  StdCallJavascriptMethodInfo info;
  EventLogEntry *callEvent;
  TTDNestingDepthAutoAdjuster logPopper_1;
  EventLog *elog;
  TTDNestingDepthAutoAdjuster local_40;
  TTDNestingDepthAutoAdjuster logPopper;
  Var result;
  JavascriptExternalFunction *externalFunction;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  CallInfo *callInfo_local;
  RecyclableObject *function_local;
  
  logPopper.m_threadContext = (ThreadContext *)0x0;
  bVar4 = ScriptContext::ShouldPerformReplayAction(scriptContext);
  if (bVar4) {
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    TTD::TTDNestingDepthAutoAdjuster::TTDNestingDepthAutoAdjuster(&local_40,pTVar5);
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    TTD::EventLog::ReplayExternalCallEvent
              (pTVar5->TTDLog,(JavascriptFunction *)function,args,&logPopper.m_threadContext);
    TTD::TTDNestingDepthAutoAdjuster::~TTDNestingDepthAutoAdjuster(&local_40);
  }
  else {
    if (0xffff < (SUB84(args->Info,0) & 0xffffff)) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec52,(PCWSTR)0x0);
    }
    bVar4 = ScriptContext::ShouldPerformRecordAction(scriptContext);
    if (!bVar4) {
      TTDAbort_unrecoverable_error("Check either record/replay before calling!!!");
    }
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    logPopper_1.m_threadContext = (ThreadContext *)pTVar5->TTDLog;
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    TTD::TTDNestingDepthAutoAdjuster::TTDNestingDepthAutoAdjuster
              ((TTDNestingDepthAutoAdjuster *)&callEvent,pTVar5);
    this = logPopper_1;
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    info._16_8_ = TTD::EventLog::RecordExternalCallEvent
                            ((EventLog *)this.m_threadContext,(JavascriptFunction *)function,
                             pTVar5->TTDRootNestingCount,args,true);
    __frameAddr = Arguments::operator[](args,0);
    bVar4 = Arguments::HasNewTarget(args);
    if (bVar4) {
      local_118 = (RecyclableObject *)Arguments::GetNewTarget(args);
    }
    else {
      bVar4 = Arguments::IsNewCall(args);
      local_128 = function;
      if (!bVar4) {
        this_00 = ScriptContext::GetLibrary(scriptContext);
        local_128 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      }
      local_118 = local_128;
    }
    info.thisArg = local_118;
    info.newTargetArg._0_1_ = Arguments::IsNewCall(args);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext,&function_local);
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c0,pTVar5);
    pTVar2 = function[5].type.ptr;
    ppvVar3 = args->Values;
    uVar1 = *(undefined2 *)&args->Info;
    ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(function + 5));
    logPopper.m_threadContext =
         (ThreadContext *)(*(code *)pTVar2)(function,ppvVar3,uVar1,&__frameAddr,*ppvVar6);
    if (scriptContext != (ScriptContext *)0x0) {
      pTVar5 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::DisposeOnLeaveScript(pTVar5);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c0);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
    TTD::EventLog::RecordExternalCallEvent_Complete
              ((EventLog *)logPopper_1.m_threadContext,(JavascriptFunction *)function,
               (EventLogEntry *)info._16_8_,logPopper.m_threadContext);
    TTD::TTDNestingDepthAutoAdjuster::~TTDNestingDepthAutoAdjuster
              ((TTDNestingDepthAutoAdjuster *)&callEvent);
  }
  return logPopper.m_threadContext;
}

Assistant:

Var JavascriptExternalFunction::HandleRecordReplayExternalFunction_StdThunk(Js::RecyclableObject* function, CallInfo& callInfo, Arguments& args, ScriptContext* scriptContext)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        Var result = nullptr;

        if(scriptContext->ShouldPerformReplayAction())
        {
            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            scriptContext->GetThreadContext()->TTDLog->ReplayExternalCallEvent(externalFunction, args, &result);
        }
        else
        {
            if (args.Info.Count > USHORT_MAX)
            {
                // Due to compat reasons, stdcall external functions expect a ushort count of args.
                // To support more than this we will need a new API.
                Js::JavascriptError::ThrowTypeError(scriptContext, JSERR_ArgListTooLarge);
            }

            TTDAssert(scriptContext->ShouldPerformRecordAction(), "Check either record/replay before calling!!!");

            TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;

            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            TTD::NSLogEvents::EventLogEntry* callEvent = elog->RecordExternalCallEvent(externalFunction, scriptContext->GetThreadContext()->TTDRootNestingCount, args, true);

            StdCallJavascriptMethodInfo info = {
                args[0],
                args.HasNewTarget() ? args.GetNewTarget() : args.IsNewCall() ? function : scriptContext->GetLibrary()->GetUndefined(),
                args.IsNewCall()
            };

            BEGIN_LEAVE_SCRIPT(scriptContext)
            {
                result = externalFunction->stdCallNativeMethod(function, args.Values, static_cast<ushort>(args.Info.Count), &info, externalFunction->callbackState);
            }
            END_LEAVE_SCRIPT(scriptContext);

            elog->RecordExternalCallEvent_Complete(externalFunction, callEvent, result);
        }

        return result;
    }